

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_imply_m(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_STATUS RVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_158;
  double dStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  REF_DBL local_38;
  REF_DBL RStack_30;
  REF_DBL local_28;
  REF_DBL RStack_20;
  REF_DBL local_18;
  REF_DBL RStack_10;
  
  m[4] = 0.0;
  m[5] = 0.0;
  m[2] = 0.0;
  m[3] = 0.0;
  *m = 0.0;
  m[1] = 0.0;
  dVar10 = *xyz1;
  dVar7 = xyz1[1];
  local_48 = xyz1[2];
  dVar1 = *xyz2;
  dVar12 = *xyz0;
  dVar2 = xyz0[1];
  local_58 = xyz0[2];
  dVar6 = dVar10 - dVar12;
  dVar8 = dVar1 - dVar12;
  local_158 = dVar6 * dVar6;
  dStack_150 = dVar8 * dVar8;
  dVar3 = xyz2[1];
  dVar9 = dVar7 - dVar2;
  dVar11 = dVar3 - dVar2;
  local_128 = (dVar6 + dVar6) * dVar9;
  dStack_120 = (dVar8 + dVar8) * dVar11;
  dVar4 = xyz2[2];
  local_68 = local_48 - local_58;
  dStack_60 = dVar4 - local_58;
  local_f8 = (dVar6 + dVar6) * local_68;
  dStack_f0 = (dVar8 + dVar8) * dStack_60;
  local_c8 = dVar9 * dVar9;
  dStack_c0 = dVar11 * dVar11;
  local_98 = (dVar9 + dVar9) * local_68;
  dStack_90 = (dVar11 + dVar11) * dStack_60;
  local_68 = local_68 * local_68;
  dStack_60 = dStack_60 * dStack_60;
  dVar6 = *xyz3;
  dVar8 = xyz3[1];
  dStack_40 = xyz3[2];
  dVar12 = dVar6 - dVar12;
  dVar11 = dVar1 - dVar10;
  local_148._8_4_ = SUB84(dVar11 * dVar11,0);
  local_148._0_8_ = dVar12 * dVar12;
  local_148._12_4_ = (int)((ulong)(dVar11 * dVar11) >> 0x20);
  dVar2 = dVar8 - dVar2;
  dVar9 = dVar3 - dVar7;
  local_118 = (dVar12 + dVar12) * dVar2;
  dStack_110 = (dVar11 + dVar11) * dVar9;
  local_58 = dStack_40 - local_58;
  dStack_50 = dVar4 - local_48;
  local_e8 = (dVar12 + dVar12) * local_58;
  dStack_e0 = (dVar11 + dVar11) * dStack_50;
  local_b8 = dVar2 * dVar2;
  dStack_b0 = dVar9 * dVar9;
  dVar12 = (dVar9 + dVar9) * dStack_50;
  local_88._8_4_ = SUB84(dVar12,0);
  local_88._0_8_ = (dVar2 + dVar2) * local_58;
  local_88._12_4_ = (int)((ulong)dVar12 >> 0x20);
  local_58 = local_58 * local_58;
  dStack_50 = dStack_50 * dStack_50;
  dVar10 = dVar6 - dVar10;
  dVar6 = dVar6 - dVar1;
  local_138._8_4_ = SUB84(dVar6 * dVar6,0);
  local_138._0_8_ = dVar10 * dVar10;
  local_138._12_4_ = (int)((ulong)(dVar6 * dVar6) >> 0x20);
  dVar7 = dVar8 - dVar7;
  dVar8 = dVar8 - dVar3;
  dVar1 = (dVar6 + dVar6) * dVar8;
  local_108._8_4_ = SUB84(dVar1,0);
  local_108._0_8_ = (dVar10 + dVar10) * dVar7;
  local_108._12_4_ = (int)((ulong)dVar1 >> 0x20);
  local_48 = dStack_40 - local_48;
  dStack_40 = dStack_40 - dVar4;
  local_d8 = (dVar10 + dVar10) * local_48;
  dStack_d0 = (dVar6 + dVar6) * dStack_40;
  local_a8._8_4_ = SUB84(dVar8 * dVar8,0);
  local_a8._0_8_ = dVar7 * dVar7;
  local_a8._12_4_ = (int)((ulong)(dVar8 * dVar8) >> 0x20);
  local_78 = (dVar7 + dVar7) * local_48;
  dStack_70 = (dVar8 + dVar8) * dStack_40;
  local_48 = local_48 * local_48;
  dStack_40 = dStack_40 * dStack_40;
  local_38 = 1.0;
  RStack_30 = 1.0;
  local_28 = 1.0;
  RStack_20 = 1.0;
  local_18 = 1.0;
  RStack_10 = 1.0;
  RVar5 = ref_matrix_solve_ab(6,7,&local_158);
  if (RVar5 == 0) {
    m[4] = local_18;
    m[5] = RStack_10;
    m[2] = local_28;
    m[3] = RStack_20;
    *m = local_38;
    m[1] = RStack_30;
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                      REF_DBL *xyz2, REF_DBL *xyz3) {
  REF_DBL ab[42];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab(0, xyz1, xyz0);
  fill_ab(1, xyz2, xyz0);
  fill_ab(2, xyz3, xyz0);
  fill_ab(3, xyz2, xyz1);
  fill_ab(4, xyz3, xyz1);
  fill_ab(5, xyz3, xyz2);

  for (i = 0; i < 6; i++) ab[i + 6 * 6] = 1.0;

  RAISE(ref_matrix_solve_ab(6, 7, ab));

  for (i = 0; i < 6; i++) m[i] = ab[i + 6 * 6];

  return REF_SUCCESS;
}